

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  LookasideSlot *pLVar1;
  void *pvVar2;
  LookasideSlot *pBuf;
  u64 n_local;
  sqlite3 *db_local;
  
  if ((db->lookaside).sz < n) {
    if ((db->lookaside).bDisable == 0) {
      (db->lookaside).anStat[1] = (db->lookaside).anStat[1] + 1;
    }
    else if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    pvVar2 = dbMallocRawFinish(db,n);
    return pvVar2;
  }
  if (n < 0x81) {
    pLVar1 = (db->lookaside).pSmallFree;
    if (pLVar1 != (LookasideSlot *)0x0) {
      (db->lookaside).pSmallFree = pLVar1->pNext;
      (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
      return pLVar1;
    }
    pLVar1 = (db->lookaside).pSmallInit;
    if (pLVar1 != (LookasideSlot *)0x0) {
      (db->lookaside).pSmallInit = pLVar1->pNext;
      (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
      return pLVar1;
    }
  }
  db_local = (sqlite3 *)(db->lookaside).pFree;
  if (db_local == (sqlite3 *)0x0) {
    db_local = (sqlite3 *)(db->lookaside).pInit;
    if (db_local == (sqlite3 *)0x0) {
      (db->lookaside).anStat[2] = (db->lookaside).anStat[2] + 1;
      db_local = (sqlite3 *)dbMallocRawFinish(db,n);
    }
    else {
      (db->lookaside).pInit = (LookasideSlot *)db_local->pVfs;
      (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
    }
  }
  else {
    (db->lookaside).pFree = (LookasideSlot *)db_local->pVfs;
    (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
  }
  return db_local;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( n>db->lookaside.sz ){
    if( !db->lookaside.bDisable ){
      db->lookaside.anStat[1]++;
    }else if( db->mallocFailed ){
      return 0;
    }
    return dbMallocRawFinish(db, n);
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( n<=LOOKASIDE_SMALL ){
    if( (pBuf = db->lookaside.pSmallFree)!=0 ){
      db->lookaside.pSmallFree = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }else if( (pBuf = db->lookaside.pSmallInit)!=0 ){
      db->lookaside.pSmallInit = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }
  }
#endif
  if( (pBuf = db->lookaside.pFree)!=0 ){
    db->lookaside.pFree = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else if( (pBuf = db->lookaside.pInit)!=0 ){
    db->lookaside.pInit = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else{
    db->lookaside.anStat[2]++;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}